

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  byte bVar1;
  pointer names_00;
  pointer ppNVar2;
  byte *pbVar3;
  ValueType floatType;
  byte *pbVar4;
  byte *in_00;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *local_80;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> local_78;
  Reference *local_60;
  Value *local_58;
  ulong local_50;
  ulong local_48;
  Reference **local_40;
  size_t *local_38;
  
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  if (in != end && in != (char *)0x0) {
    uVar6 = (ulong)(uint)type;
    pbVar4 = (byte *)in;
    do {
      in = (char *)pbVar4;
      if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
      break;
      pbVar4 = (byte *)in + 1;
      in = end;
    } while (pbVar4 != (byte *)end);
    if ((in != end) && (*in == 0x7b)) {
      pbVar4 = (byte *)in + 1;
      if (pbVar4 != (byte *)end) {
        local_58 = (Value *)0x0;
        uVar5 = (ulong)(uint)(type + ddl_int8);
        local_40 = refs;
        local_38 = numValues;
LAB_00106466:
        if (*pbVar4 != 0x7d) {
          local_80 = (Value *)0x0;
          do {
            in_00 = pbVar4;
            if ((0x2c < (ulong)*pbVar4) || ((0x100100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
            break;
            pbVar4 = pbVar4 + 1;
            in_00 = (byte *)end;
          } while (pbVar4 != (byte *)end);
          if (0xe < (uint)uVar5) goto switchD_001064ac_caseD_1066f9;
          floatType = (ValueType)uVar6;
          switch((long)&switchD_001064ac::switchdataD_0010a320 +
                 (long)(int)(&switchD_001064ac::switchdataD_0010a320)[uVar5]) {
          case 0x1064ae:
LAB_001064bc:
            in_00 = (byte *)parseIntegerLiteral((char *)in_00,end,&local_80,floatType);
            break;
          case 0x1064c6:
LAB_001064d4:
            in_00 = (byte *)parseFloatingLiteral((char *)in_00,end,&local_80,floatType);
            break;
          case 0x1064de:
            pbVar4 = in_00;
            if (in_00 != (byte *)end) {
              pbVar4 = in_00 + (*in_00 == 0x2d);
            }
            bVar7 = false;
            do {
              bVar1 = *pbVar4;
              if ((((bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                  (bVar1 == 0x7d)) || ((pbVar4 == (byte *)end || (bVar1 == 0x29)))) break;
              if ((char)bVar1 < '\0') {
                bVar7 = false;
              }
              else {
                bVar7 = chartype_table[bVar1] == '\x01';
              }
              pbVar4 = pbVar4 + 1;
            } while (bVar7);
            if (bVar7) {
              floatType = ddl_int32;
              goto LAB_001064bc;
            }
            pbVar4 = in_00;
            if (in_00 != (byte *)end) {
              pbVar4 = in_00 + (*in_00 == 0x2d);
            }
            bVar7 = false;
            pbVar3 = pbVar4;
            while( true ) {
              pbVar3 = pbVar3 + 1;
              bVar1 = *pbVar4;
              if (((bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                 ((bVar1 == 0x7d || ((pbVar4 == (byte *)end || (bVar1 == 0x29)))))) break;
              if (bVar1 == 0x2e) {
                bVar7 = true;
                break;
              }
              if ((char)bVar1 < '\0') {
                bVar7 = false;
              }
              else {
                bVar7 = chartype_table[bVar1] == '\x01';
              }
              if (!bVar7) goto LAB_001066d4;
              pbVar4 = pbVar4 + 1;
            }
            if (bVar1 == 0x2e) goto LAB_00106674;
            goto LAB_001066d4;
          case 0x106556:
            local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (Name **)0x0;
            local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (Name **)0x0;
            local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_50 = uVar5;
            local_48 = uVar6;
            in_00 = (byte *)parseReference((char *)in_00,end,&local_78);
            ppNVar2 = local_78.
                      super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            names_00 = local_78.
                       super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_60 = (Reference *)operator_new(0x10);
              Reference::Reference(local_60,(long)ppNVar2 - (long)names_00 >> 3,names_00);
              *local_40 = local_60;
              *numRefs = (long)local_78.
                               super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.
                               super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3;
            }
            uVar6 = local_48;
            uVar5 = local_50;
            if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (Name **)0x0) {
              operator_delete(local_78.
                              super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.
                                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.
                                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              uVar5 = local_50;
            }
            break;
          case 0x1066e6:
            goto switchD_001064ac_caseD_1066e6;
          }
          goto switchD_001064ac_caseD_1066f9;
        }
      }
LAB_001067cb:
      in = (char *)(pbVar4 + (pbVar4 != (byte *)end));
    }
  }
  return (char *)(byte *)in;
  while( true ) {
    if ((char)bVar1 < '\0') {
      bVar7 = false;
    }
    else {
      bVar7 = chartype_table[bVar1] == '\x01';
    }
    pbVar3 = pbVar3 + 1;
    if (!bVar7) break;
LAB_00106674:
    bVar1 = *pbVar3;
    if ((((bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
        (bVar1 == 0x7d)) || ((pbVar3 == (byte *)end || (bVar1 == 0x29)))) {
      if (bVar7) {
        floatType = ddl_float;
        goto LAB_001064d4;
      }
      break;
    }
  }
LAB_001066d4:
  if (*in_00 == 0x30) {
    if ((in_00 + 1 != (byte *)end) && ((in_00[1] + 0xa8 & 0xdf) == 0)) {
      in_00 = (byte *)parseHexaLiteral((char *)in_00,end,&local_80);
    }
  }
  else if (*in_00 == 0x22) {
switchD_001064ac_caseD_1066e6:
    in_00 = (byte *)parseStringLiteral((char *)in_00,end,&local_80);
  }
switchD_001064ac_caseD_1066f9:
  pbVar4 = in_00;
  if (local_80 != (Value *)0x0) {
    if (*data == (Value *)0x0) {
      *data = local_80;
    }
    else {
      Value::setNext(local_58,local_80);
    }
    local_58 = local_80;
    *local_38 = *local_38 + 1;
  }
  for (; in_00 != (byte *)end; in_00 = in_00 + 1) {
    bVar1 = *in_00;
    pbVar4 = in_00;
    if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
    break;
    pbVar4 = (byte *)end;
  }
  if (pbVar4 == (byte *)end) goto LAB_001067cb;
  bVar1 = *pbVar4;
  if ((((0x2c < (ulong)bVar1) || ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
      (bVar1 != 0x7d)) || (pbVar4 == (byte *)end)) goto LAB_001067cb;
  goto LAB_00106466;
}

Assistant:

char *OpenDDLParser::parseDataList(char *in, char *end, Value::ValueType type, Value **data,
        size_t &numValues, Reference **refs, size_t &numRefs) {
    *data = nullptr;
    numValues = numRefs = 0;
    if (nullptr == in || in == end) {
        return in;
    }

    in = lookForNextToken(in, end);
    if (in != end && *in == '{') {
        ++in;
        Value *current(nullptr), *prev(nullptr);
        while (in != end && '}' != *in) {
            current = nullptr;
            in = lookForNextToken(in, end);
            if (Value::ValueType::ddl_ref == type) {
                std::vector<Name *> names;
                in = parseReference(in, end, names);
                if (!names.empty()) {
                    Reference *ref = new Reference(names.size(), &names[0]);
                    *refs = ref;
                    numRefs = names.size();
                }
            } else if (Value::ValueType::ddl_none == type) {
                if (isInteger(in, end)) {
                    in = parseIntegerLiteral(in, end, &current);
                } else if (isFloat(in, end)) {
                    in = parseFloatingLiteral(in, end, &current);
                } else if (isStringLiteral(*in)) {
                    in = parseStringLiteral(in, end, &current);
                } else if (isHexLiteral(in, end)) {
                    in = parseHexaLiteral(in, end, &current);
                }
            } else {
                switch (type) {
                    case Value::ValueType::ddl_int8:
                    case Value::ValueType::ddl_int16:
                    case Value::ValueType::ddl_int32:
                    case Value::ValueType::ddl_int64:
                    case Value::ValueType::ddl_unsigned_int8:
                    case Value::ValueType::ddl_unsigned_int16:
                    case Value::ValueType::ddl_unsigned_int32:
                    case Value::ValueType::ddl_unsigned_int64:
                        in = parseIntegerLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_half:
                    case Value::ValueType::ddl_float:
                    case Value::ValueType::ddl_double:
                        in = parseFloatingLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_string:
                        in = parseStringLiteral(in, end, &current);
                        break;
                    default:
                        break;
                }
            }

            if (nullptr != current) {
                if (nullptr == *data) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext(current);
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator(in, end);
            if (in == end || (',' != *in && Grammar::CloseBracketToken[0] != *in && !isSpace(*in))) {
                break;
            }
        }
        if (in != end)
            ++in;
    }

    return in;
}